

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoli.c
# Opt level: O0

int ffpcni(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          short *array,short nulvalue,int *status)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  long in_R8;
  long in_R9;
  int overflow;
  int tcode;
  LONGLONG fstrow;
  LONGLONG fstelm;
  LONGLONG first;
  LONGLONG repeat;
  LONGLONG ii;
  LONGLONG nbad;
  LONGLONG ngood;
  tcolumn *colptr;
  int *in_stack_00000080;
  fitsfile *in_stack_00000088;
  int *in_stack_000001a0;
  LONGLONG in_stack_000001a8;
  LONGLONG in_stack_000001b0;
  LONGLONG in_stack_000001b8;
  int in_stack_000001c4;
  fitsfile *in_stack_000001c8;
  short *in_stack_00007200;
  LONGLONG in_stack_00007208;
  LONGLONG in_stack_00007210;
  LONGLONG in_stack_00007218;
  int in_stack_00007224;
  fitsfile *in_stack_00007228;
  int *in_stack_00007270;
  long local_58;
  long local_50;
  long local_48;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_48 = 0;
  local_50 = 0;
  bVar1 = false;
  if (*(int *)fstrow < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar2 = ffrdef(in_stack_00000088,in_stack_00000080), 0 < iVar2)) {
        return *(int *)fstrow;
      }
    }
    else {
      ffmahd((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (int)((ulong)in_RDI >> 0x20),(int *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
    }
    iVar2 = *(int *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0 + 0x50);
    if ((iVar2 < 0) &&
       (iVar3 = ffpcli(in_stack_00007228,in_stack_00007224,in_stack_00007218,in_stack_00007210,
                       in_stack_00007208,in_stack_00007200,in_stack_00007270), 0 < iVar3)) {
      if (*(int *)fstrow != 0x19c) {
        return *(int *)fstrow;
      }
      *(undefined4 *)fstrow = 0;
    }
    for (local_58 = 0; local_58 < in_R8; local_58 = local_58 + 1) {
      if (*(short *)(in_R9 + local_58 * 2) == (short)overflow) {
        if (local_48 != 0) {
          if ((0 < iVar2) &&
             (iVar3 = ffpcli(in_stack_00007228,in_stack_00007224,in_stack_00007218,in_stack_00007210
                             ,in_stack_00007208,in_stack_00007200,in_stack_00007270), 0 < iVar3)) {
            if (*(int *)fstrow != 0x19c) {
              return *(int *)fstrow;
            }
            bVar1 = true;
            *(undefined4 *)fstrow = 0;
          }
          local_48 = 0;
        }
        local_50 = local_50 + 1;
      }
      else {
        if (local_50 != 0) {
          iVar3 = ffpclu(in_stack_000001c8,in_stack_000001c4,in_stack_000001b8,in_stack_000001b0,
                         in_stack_000001a8,in_stack_000001a0);
          if (0 < iVar3) {
            return *(int *)fstrow;
          }
          local_50 = 0;
        }
        local_48 = local_48 + 1;
      }
    }
    if (local_48 == 0) {
      if (local_50 != 0) {
        ffpclu(in_stack_000001c8,in_stack_000001c4,in_stack_000001b8,in_stack_000001b0,
               in_stack_000001a8,in_stack_000001a0);
      }
    }
    else if (0 < iVar2) {
      ffpcli(in_stack_00007228,in_stack_00007224,in_stack_00007218,in_stack_00007210,
             in_stack_00007208,in_stack_00007200,in_stack_00007270);
    }
    if ((*(int *)fstrow < 1) && (bVar1)) {
      *(undefined4 *)fstrow = 0x19c;
    }
    iVar2 = *(int *)fstrow;
  }
  else {
    iVar2 = *(int *)fstrow;
  }
  return iVar2;
}

Assistant:

int ffpcni( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            short *array,    /* I - array of values to write                */
            short  nulvalue, /* I - value used to flag undefined pixels     */
            int  *status)    /* IO - error status                           */
/*
  Write an array of elements to the specified column of a table.  Any input
  pixels equal to the value of nulvalue will be replaced by the appropriate
  null value in the output FITS file. 

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary
*/
{
    tcolumn *colptr;
    LONGLONG  ngood = 0, nbad = 0, ii;
    LONGLONG repeat, first, fstelm, fstrow;
    int tcode, overflow = 0;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode  = colptr->tdatatype;

    if (tcode > 0)
       repeat = colptr->trepeat;  /* repeat count for this column */
    else
       repeat = firstelem -1 + nelem;  /* variable length arrays */

    /* if variable length array, first write the whole input vector, 
       then go back and fill in the nulls */
    if (tcode < 0) {
      if (ffpcli(fptr, colnum, firstrow, firstelem, nelem, array, status) > 0) {
        if (*status == NUM_OVERFLOW) 
	{
	  /* ignore overflows, which are possibly the null pixel values */
	  /*  overflow = 1;   */
	  *status = 0;
	} else { 
          return(*status);
	}
      }
    }

    /* absolute element number in the column */
    first = (firstrow - 1) * repeat + firstelem;

    for (ii = 0; ii < nelem; ii++)
    {
      if (array[ii] != nulvalue)  /* is this a good pixel? */
      {
         if (nbad)  /* write previous string of bad pixels */
         {
            fstelm = ii - nbad + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (ffpclu(fptr, colnum, fstrow, fstelm, nbad, status) > 0)
                return(*status);

            nbad=0;
         }

         ngood = ngood +1;  /* the consecutive number of good pixels */
      }
      else
      {
         if (ngood)  /* write previous string of good pixels */
         {
            fstelm = ii - ngood + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (tcode > 0) {  /* variable length arrays have already been written */
              if (ffpcli(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood],
                status) > 0) {
		if (*status == NUM_OVERFLOW) 
		{
		  overflow = 1;
		  *status = 0;
		} else { 
                  return(*status);
		}
	      }
	    }
            ngood=0;
         }

         nbad = nbad +1;  /* the consecutive number of bad pixels */
      }
    }

    /* finished loop;  now just write the last set of pixels */

    if (ngood)  /* write last string of good pixels */
    {
      fstelm = ii - ngood + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      if (tcode > 0) {  /* variable length arrays have already been written */
        ffpcli(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood], status);
      }
    }
    else if (nbad) /* write last string of bad pixels */
    {
      fstelm = ii - nbad + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      ffpclu(fptr, colnum, fstrow, fstelm, nbad, status);
    }

    if (*status <= 0) {
      if (overflow) {
        *status = NUM_OVERFLOW;
      }
    }

    return(*status);
}